

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_state.cpp
# Opt level: O1

void __thiscall
duckdb::PartitionMergeTask::PartitionMergeTask
          (PartitionMergeTask *this,shared_ptr<duckdb::Event,_true> *event_p,
          ClientContext *context_p,PartitionGlobalMergeStates *hash_groups_p,
          PartitionGlobalSinkState *gstate,PhysicalOperator *op)

{
  shared_ptr<duckdb::Event,_true> local_28;
  
  local_28.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_28.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ExecutorTask::ExecutorTask(&this->super_ExecutorTask,context_p,&local_28,op);
  if (local_28.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_ExecutorTask).super_Task._vptr_Task = (_func_int **)&PTR__PartitionMergeTask_02498f70
  ;
  PartitionLocalMergeState::PartitionLocalMergeState(&this->local_state,gstate);
  this->hash_groups = hash_groups_p;
  return;
}

Assistant:

PartitionMergeTask(shared_ptr<Event> event_p, ClientContext &context_p, PartitionGlobalMergeStates &hash_groups_p,
	                   PartitionGlobalSinkState &gstate, const PhysicalOperator &op)
	    : ExecutorTask(context_p, std::move(event_p), op), local_state(gstate), hash_groups(hash_groups_p) {
	}